

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

void __thiscall QBitArray::QBitArray(QBitArray *this,qsizetype size,bool value)

{
  char *data;
  qsizetype size_00;
  
  size_00 = 0;
  if (0 < size) {
    size_00 = (size + 7U >> 3) + 1;
  }
  QByteArray::QByteArray(&this->d,size_00,-value);
  if (0 < size) {
    data = QByteArray::data(&this->d);
    adjust_head_and_tail(data,(this->d).d.size,size);
    return;
  }
  return;
}

Assistant:

QBitArray::QBitArray(qsizetype size, bool value)
    : d(allocation_size(size), value ? 0xFF : 0x00)
{
    Q_ASSERT_X(size >= 0, "QBitArray::QBitArray", "Size must be greater than or equal to 0.");
    if (size <= 0)
        return;

    adjust_head_and_tail(d.data(), d.size(), size);
}